

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O1

JSValue js_number_toString(JSContext *ctx,JSValue this_val,int argc,JSValue *argv,int magic)

{
  int iVar1;
  JSValueUnion in_RAX;
  JSValueUnion JVar2;
  uint uVar3;
  ulong uVar4;
  uint32_t tag;
  uint uVar5;
  int64_t iVar6;
  undefined4 radix;
  JSValueUnion JVar7;
  JSValue JVar8;
  JSValue JVar9;
  JSValue val;
  double d;
  JSValueUnion local_38;
  
  local_38 = in_RAX;
  JVar8 = js_thisNumberValue(ctx,this_val);
  uVar5 = (uint)JVar8.tag;
  if (uVar5 == 6) {
    JVar2.float64 = -NAN;
    JVar7 = JVar8.u;
  }
  else {
    radix = 10;
    if (magic == 0) {
      iVar6 = argv->tag;
      uVar3 = (uint)iVar6;
      if (uVar3 == 3) goto LAB_0016a0cd;
      local_38 = argv->u;
      if (0xfffffff4 < uVar3) {
        *(int *)local_38.ptr = *local_38.ptr + 1;
      }
      val.tag = iVar6;
      val.u.float64 = local_38.float64;
      iVar1 = JS_ToInt32SatFree(ctx,&local_38.int32,val);
      radix = -1;
      if ((iVar1 == 0) && (radix = local_38.int32, local_38.int32 - 0x25U < 0xffffffdd)) {
        JS_ThrowRangeError(ctx,"radix must be between 2 and 36");
        radix = -1;
      }
      if (-1 < (int)radix) goto LAB_0016a0cd;
      JS_FreeValue(ctx,JVar8);
LAB_0016a14b:
      iVar6 = 6;
      JVar7.float64 = 0.0;
      uVar4 = 0;
      goto LAB_0016a125;
    }
LAB_0016a0cd:
    if (uVar5 < 3) {
      JVar7.float64 = (double)JVar8.u._0_4_;
    }
    else {
      JVar7 = JVar8.u;
      if ((uVar5 != 7) &&
         (iVar1 = __JS_ToFloat64Free(ctx,&local_38.float64,JVar8), JVar7 = local_38, iVar1 != 0))
      goto LAB_0016a14b;
    }
    local_38 = JVar7;
    JVar8 = js_dtoa(ctx,local_38.float64,radix,0,0);
    JVar2 = JVar8.u;
    JVar8.tag = JVar8.tag;
    JVar8.u.float64 = -NAN;
    JVar7 = JVar2;
  }
  iVar6 = JVar8.tag;
  uVar4 = (ulong)JVar8.u.ptr & (ulong)JVar2.ptr;
LAB_0016a125:
  JVar9.u.ptr = (void *)((ulong)JVar7.ptr & 0xffffffff | uVar4);
  JVar9.tag = iVar6;
  return JVar9;
}

Assistant:

static JSValue js_number_toString(JSContext *ctx, JSValueConst this_val,
                                  int argc, JSValueConst *argv, int magic)
{
    JSValue val;
    int base;
    double d;

    val = js_thisNumberValue(ctx, this_val);
    if (JS_IsException(val))
        return val;
    if (magic || JS_IsUndefined(argv[0])) {
        base = 10;
    } else {
        base = js_get_radix(ctx, argv[0]);
        if (base < 0)
            goto fail;
    }
    if (JS_ToFloat64Free(ctx, &d, val))
        return JS_EXCEPTION;
    return js_dtoa(ctx, d, base, 0, JS_DTOA_VAR_FORMAT);
 fail:
    JS_FreeValue(ctx, val);
    return JS_EXCEPTION;
}